

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.h
# Opt level: O0

void __thiscall stk::StkError::printMessage(StkError *this)

{
  ostream *poVar1;
  StkError *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
  poVar1 = std::operator<<(poVar1,(string *)&this->message_);
  std::operator<<(poVar1,"\n\n");
  return;
}

Assistant:

virtual void printMessage(void) { std::cerr << '\n' << message_ << "\n\n"; }